

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::initPrograms
          (TextureGatherCubeCase *this,SourceCollections *dst)

{
  GatherType gatherType;
  OffsetSize OVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  long lVar4;
  pointer pGVar5;
  undefined4 uVar6;
  pointer pGVar7;
  size_t __n;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_60;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  local_48;
  
  gatherType = (this->m_baseParams).gatherType;
  __n = (size_t)gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  if (OVar1 == OFFSETSIZE_NONE) {
    uVar3 = 0;
    uVar6 = 0;
  }
  else {
    if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
      local_60.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_00622c71;
    }
    if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
      uVar6 = 7;
      uVar3 = 0xfffffff8;
    }
    else {
      uVar3 = 0xffffffff;
      uVar6 = 0xffffffff;
    }
  }
  local_60.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar6,uVar3);
LAB_00622c71:
  generateCubeCaseIterations
            (&local_48,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_60);
  lVar4 = (long)local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  if ((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
       *)0x38e38e38e38e38e <
      (_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
       *)(lVar4 * -0x3333333333333333)) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  pGVar5 = std::
           _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                          *)(lVar4 * -0x3333333333333333),__n);
  local_60.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(lVar4 * -0x333333333333332c + (long)pGVar5);
  local_60.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_finish = pGVar5;
  for (pGVar7 = local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar7 != local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar7 = pGVar7 + 1) {
    (local_60.
     super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
     ._M_impl.super__Vector_impl_data._M_finish)->componentNdx = (pGVar7->gatherArgs).componentNdx;
    uVar2 = *(undefined8 *)(pGVar7->gatherArgs).offsets[1].m_data;
    *(undefined8 *)
     (local_60.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[0].m_data =
         *(undefined8 *)(pGVar7->gatherArgs).offsets[0].m_data;
    *(undefined8 *)
     (local_60.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[1].m_data = uVar2;
    uVar2 = *(undefined8 *)(pGVar7->gatherArgs).offsets[3].m_data;
    *(undefined8 *)
     (local_60.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[2].m_data =
         *(undefined8 *)(pGVar7->gatherArgs).offsets[2].m_data;
    *(undefined8 *)
     (local_60.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
      ._M_impl.super__Vector_impl_data._M_finish)->offsets[3].m_data = uVar2;
    local_60.
    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_60.
         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_60.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_start = pGVar5;
  genGatherPrograms(dst,&this->m_baseParams,&local_60);
  if (pGVar5 != (pointer)0x0) {
    operator_delete(pGVar5,lVar4 * -0x333333333333332c);
  }
  if (local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void TextureGatherCubeCase::initPrograms (vk::SourceCollections& dst) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 m_baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(m_baseParams.offsetSize) : IVec2(0));

	genGatherPrograms(dst, m_baseParams, vector<GatherArgs>(iterations.begin(), iterations.end()));
}